

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_movem_er(m68k_info *info,int opcode,int size)

{
  uint uVar1;
  cs_m68k *op;
  undefined4 in_EDX;
  undefined4 in_ESI;
  cs_m68k *ext;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  undefined8 in_stack_ffffffffffffffe0;
  m68k_info *info_00;
  undefined8 in_stack_ffffffffffffffe8;
  
  op = build_init_op((m68k_info *)CONCAT44(in_ESI,in_EDX),
                     (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),(int)in_stack_ffffffffffffffe8,
                     (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  info_00 = (m68k_info *)(op->operands + 1);
  op->operands[1].type = M68K_OP_REG_BITS;
  uVar1 = read_imm_16(info_00);
  info_00->address_mask = uVar1;
  get_ea_mode_op((m68k_info *)CONCAT44(in_ESI,in_EDX),op->operands,(uint)((ulong)info_00 >> 0x20),
                 (uint)info_00);
  return;
}

Assistant:

static void build_movem_er(m68k_info *info, int opcode, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op1->type = M68K_OP_REG_BITS;
	op1->register_bits = read_imm_16(info);

	get_ea_mode_op(info, op0, info->ir, size);
}